

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

void google::protobuf::compiler::cpp::GenerateUtf8CheckCode
               (FieldDescriptor *field,Options *options,bool for_parse,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,char *parameters,char *strict_function,char *verify_function,
               Printer *printer)

{
  char *text;
  allocator local_51;
  string local_50;
  
  if (*(int *)(*(long *)(field + 0x30) + 0x8c) == 3) {
    if (for_parse) {
      io::Printer::Print(printer,"DO_(");
    }
    std::__cxx11::string::string((string *)&local_50,strict_function,&local_51);
    io::Printer::Print(printer,"::google::protobuf::internal::WireFormatLite::$function$(\n",
                       "function",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    io::Printer::Indent(printer);
    io::Printer::Print(printer,variables,parameters);
    if (for_parse) {
      io::Printer::Print(printer,"::google::protobuf::internal::WireFormatLite::PARSE,\n");
      io::Printer::Print(printer,"\"$full_name$\")","full_name",*(string **)(field + 8));
      io::Printer::Print(printer,")");
    }
    else {
      io::Printer::Print(printer,"::google::protobuf::internal::WireFormatLite::SERIALIZE,\n");
      io::Printer::Print(printer,"\"$full_name$\")","full_name",*(string **)(field + 8));
    }
    io::Printer::Print(printer,";\n");
  }
  else {
    if (((ulong)options & 1) != 0) {
      return;
    }
    if (*(int *)(*(long *)(*(long *)(field + 0x30) + 0xa0) + 0xa8) == 3) {
      return;
    }
    std::__cxx11::string::string((string *)&local_50,verify_function,&local_51);
    io::Printer::Print(printer,"::google::protobuf::internal::WireFormat::$function$(\n","function",
                       &local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    io::Printer::Indent(printer);
    io::Printer::Print(printer,variables,parameters);
    text = "::google::protobuf::internal::WireFormat::SERIALIZE,\n";
    if (for_parse) {
      text = "::google::protobuf::internal::WireFormat::PARSE,\n";
    }
    io::Printer::Print(printer,text);
    io::Printer::Print(printer,"\"$full_name$\");\n","full_name",*(string **)(field + 8));
  }
  io::Printer::Outdent(printer);
  return;
}

Assistant:

static void GenerateUtf8CheckCode(const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  const std::map<string, string>& variables,
                                  const char* parameters,
                                  const char* strict_function,
                                  const char* verify_function,
                                  io::Printer* printer) {
  switch (GetUtf8CheckMode(field, options)) {
    case STRICT: {
      if (for_parse) {
        printer->Print("DO_(");
      }
      printer->Print(
          "::google::protobuf::internal::WireFormatLite::$function$(\n",
          "function", strict_function);
      printer->Indent();
      printer->Print(variables, parameters);
      if (for_parse) {
        printer->Print("::google::protobuf::internal::WireFormatLite::PARSE,\n");
      } else {
        printer->Print("::google::protobuf::internal::WireFormatLite::SERIALIZE,\n");
      }
      printer->Print("\"$full_name$\")", "full_name", field->full_name());
      if (for_parse) {
        printer->Print(")");
      }
      printer->Print(";\n");
      printer->Outdent();
      break;
    }
    case VERIFY: {
      printer->Print(
          "::google::protobuf::internal::WireFormat::$function$(\n",
          "function", verify_function);
      printer->Indent();
      printer->Print(variables, parameters);
      if (for_parse) {
        printer->Print("::google::protobuf::internal::WireFormat::PARSE,\n");
      } else {
        printer->Print("::google::protobuf::internal::WireFormat::SERIALIZE,\n");
      }
      printer->Print("\"$full_name$\");\n", "full_name", field->full_name());
      printer->Outdent();
      break;
    }
    case NONE:
      break;
  }
}